

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolderTests.cpp
# Opt level: O2

void __thiscall SOH_contained_Test::SOH_contained_Test(SOH_contained_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00161e08;
  return;
}

Assistant:

TEST(SOH, contained)
{
    SearchableObjectHolder<std::string> SOH1;
    EXPECT_TRUE(SOH1.empty());
    SOH1.addObject("test1", std::make_shared<std::string>("test_1"));
    SOH1.addObject("test2", std::make_shared<std::string>("test_2"));
    SOH1.addObject("test3", std::make_shared<std::string>("test_3"));

    auto objects = SOH1.getObjects();
    ASSERT_EQ(objects.size(), 3U);
    EXPECT_EQ(*(objects[0]), "test_1");
    EXPECT_EQ(*(objects[1]), "test_2");
    EXPECT_EQ(*(objects[2]), "test_3");
    objects.clear();
}